

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_SPLICE(DisasContext_conflict1 *s,arg_rprr_esz *a)

{
  TCGContext_conflict1 *tcg_ctx;
  undefined1 uVar1;
  undefined1 extraout_AL;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = sve_access_check_aarch64(s);
  if ((bool)uVar1) {
    tcg_gen_gvec_4_ool_aarch64
              (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,a->rm * 0x100 + 0xc10,
               a->pg * 0x20 + 0x2c10,s->sve_len,s->sve_len,a->esz,gen_helper_sve_splice);
    uVar1 = extraout_AL;
  }
  return (_Bool)uVar1;
}

Assistant:

static bool trans_SPLICE(DisasContext *s, arg_rprr_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_4_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           pred_full_reg_offset(s, a->pg),
                           vsz, vsz, a->esz, gen_helper_sve_splice);
    }
    return true;
}